

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

bool __thiscall ON_PostEffect::GetAllParameters(ON_PostEffect *this,ON_PostEffectParams *params)

{
  int iVar1;
  undefined4 extraout_var;
  ON_PostEffectParams local_40;
  ON_XMLNode *local_30;
  ON_XMLNode *pep_param_node;
  ON_XMLNode *pep_node;
  ON_PostEffectParams *params_local;
  ON_PostEffect *this_local;
  
  pep_node = (ON_XMLNode *)params;
  params_local = (ON_PostEffectParams *)this;
  pep_param_node = CImpl::PepNode(this->_impl);
  if (pep_param_node == (ON_XMLNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = (*pep_param_node->_vptr_ON_XMLNode[0x25])(pep_param_node,L"state");
    local_30 = (ON_XMLNode *)CONCAT44(extraout_var,iVar1);
    if (local_30 == (ON_XMLNode *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      ON_PostEffectParams::ON_PostEffectParams(&local_40,local_30);
      ON_PostEffectParams::operator=((ON_PostEffectParams *)pep_node,&local_40);
      ON_PostEffectParams::~ON_PostEffectParams(&local_40);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PostEffect::GetAllParameters(ON_PostEffectParams& params) const
{
  const ON_XMLNode* pep_node = _impl->PepNode();
  if (nullptr == pep_node)
    return false;

  const ON_XMLNode* pep_param_node = pep_node->GetNamedChild(ON_RDK_PEP_PARAMS);
  if (nullptr == pep_param_node)
    return false;

  params = ON_PostEffectParams(*pep_param_node);

  return true;
}